

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportInstallFileGenerator::GenerateImportTargetsConfig
          (cmExportInstallFileGenerator *this,ostream *os,string *config,string *suffix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmExportSet *pcVar1;
  cmTargetExport *pcVar2;
  TargetType TVar3;
  pointer ppcVar4;
  cmGeneratorTarget *pcVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  importedLocations;
  ImportPropertyMap properties;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  pcVar1 = this->IEGen->ExportSet;
  ppcVar4 = (pcVar1->TargetExports).
            super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar4 !=
      (pcVar1->TargetExports).
      super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pcVar2 = *ppcVar4;
      pcVar5 = pcVar2->Target;
      TVar3 = cmGeneratorTarget::GetType(pcVar5);
      if (TVar3 != INTERFACE_LIBRARY) {
        local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_60._M_impl.super__Rb_tree_header._M_header;
        local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_90._M_impl.super__Rb_tree_header._M_header;
        local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_90._M_impl.super__Rb_tree_header._M_header._M_right =
             local_90._M_impl.super__Rb_tree_header._M_header._M_left;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right =
             local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar5,config,suffix,pcVar2->ArchiveGenerator,
                   (ImportPropertyMap *)&local_60,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar5,config,suffix,pcVar2->LibraryGenerator,
                   (ImportPropertyMap *)&local_60,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar5,config,suffix,pcVar2->RuntimeGenerator,
                   (ImportPropertyMap *)&local_60,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar5,config,suffix,pcVar2->ObjectsGenerator,
                   (ImportPropertyMap *)&local_60,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar5,config,suffix,pcVar2->FrameworkGenerator,
                   (ImportPropertyMap *)&local_60,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90);
        SetImportLocationProperty
                  ((cmExportInstallFileGenerator *)pcVar5,config,suffix,pcVar2->BundleGenerator,
                   (ImportPropertyMap *)&local_60,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90);
        if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
          pcVar5 = pcVar2->Target;
          cmExportFileGenerator::SetImportDetailProperties
                    (&this->super_cmExportFileGenerator,config,suffix,pcVar5,
                     (ImportPropertyMap *)&local_60,missingTargets);
          cmExportFileGenerator::SetImportLinkInterface
                    (&this->super_cmExportFileGenerator,config,suffix,InstallInterface,pcVar5,
                     (ImportPropertyMap *)&local_60,missingTargets);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                    (this,os,config,pcVar5,&local_60);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[8])
                    (this,os,pcVar5,&local_60,&local_90);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_90);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_60);
      }
      ppcVar4 = ppcVar4 + 1;
    } while (ppcVar4 !=
             (this->IEGen->ExportSet->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix,
  std::vector<std::string>& missingTargets)
{
  // Add each target in the set to the export.
  for (std::vector<cmTargetExport*>::const_iterator tei =
         this->IEGen->GetExportSet()->GetTargetExports()->begin();
       tei != this->IEGen->GetExportSet()->GetTargetExports()->end(); ++tei) {
    // Collect import properties for this target.
    cmTargetExport const* te = *tei;
    if (te->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    ImportPropertyMap properties;
    std::set<std::string> importedLocations;

    this->SetImportLocationProperty(config, suffix, te->ArchiveGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->LibraryGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->RuntimeGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->ObjectsGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->FrameworkGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->BundleGenerator,
                                    properties, importedLocations);

    // If any file location was set for the target add it to the
    // import file.
    if (!properties.empty()) {
      // Get the rest of the target details.
      cmGeneratorTarget* gtgt = te->Target;
      this->SetImportDetailProperties(config, suffix, gtgt, properties,
                                      missingTargets);

      this->SetImportLinkInterface(config, suffix,
                                   cmGeneratorExpression::InstallInterface,
                                   gtgt, properties, missingTargets);

      // TOOD: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      this->GenerateImportPropertyCode(os, config, gtgt, properties);
      this->GenerateImportedFileChecksCode(os, gtgt, properties,
                                           importedLocations);
    }
  }
}